

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasgridWrapper.cpp
# Opt level: O2

void __thiscall TasgridWrapper::loadComputedValues(TasgridWrapper *this)

{
  Data2D<double> *this_00;
  Data2D<double> v;
  Data2D<double> x;
  Data2D<double> local_a0;
  _Vector_base<double,_std::allocator<double>_> local_78;
  _Vector_base<double,_std::allocator<double>_> local_58;
  Data2D<double> local_38;
  
  verifiedRead(&local_a0,this,&this->valsfilename,this->num_outputs);
  if (this->command == command_loadvalues) {
    local_38.stride =
         (size_t)local_a0.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
    local_38.num_strips =
         (size_t)local_a0.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish;
    local_38.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
    ._M_start = local_a0.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    local_a0.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
    ._M_start = (pointer)0x0;
    local_a0.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
    ._M_finish = (pointer)0x0;
    local_a0.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage = (pointer)0x0;
    TasGrid::TasmanianSparseGrid::loadNeededValues((vector *)this);
    this_00 = &local_38;
  }
  else {
    if (this->field_0x70 == '\0') {
      TasGrid::TasmanianSparseGrid::beginConstruction();
    }
    verifiedRead(&local_38,this,&this->xfilename,this->num_dimensions);
    this_00 = (Data2D<double> *)&local_38.vec;
    local_58._M_impl.super__Vector_impl_data._M_start =
         local_38.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_58._M_impl.super__Vector_impl_data._M_finish =
         local_38.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_58._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_38.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_38.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
    ._M_start = (pointer)0x0;
    local_38.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
    ._M_finish = (pointer)0x0;
    local_38.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage = (pointer)0x0;
    local_78._M_impl.super__Vector_impl_data._M_start =
         local_a0.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_78._M_impl.super__Vector_impl_data._M_finish =
         local_a0.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_78._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_a0.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_a0.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
    ._M_start = (pointer)0x0;
    local_a0.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
    ._M_finish = (pointer)0x0;
    local_a0.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage = (pointer)0x0;
    TasGrid::TasmanianSparseGrid::loadConstructedPoints((vector *)this,(vector *)&local_58);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_78);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_58);
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)this_00);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&local_a0.vec.super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

void TasgridWrapper::loadComputedValues(){
    auto v = verifiedRead(valsfilename, num_outputs);
    if (command == command_loadvalues){
        grid.loadNeededValues(v.release());
    }else{
        if (not grid.isUsingConstruction())
            grid.beginConstruction();
        auto x = verifiedRead(xfilename, num_dimensions);
        grid.loadConstructedPoints(x.release(), v.release());
    }
}